

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O2

Float __thiscall pbrt::LanczosSincFilter::Evaluate(LanczosSincFilter *this,Point2f *p)

{
  Float FVar1;
  Float FVar2;
  
  FVar1 = WindowedSinc((p->super_Tuple2<pbrt::Point2,_float>).x,
                       (this->radius).super_Tuple2<pbrt::Vector2,_float>.x,this->tau);
  FVar2 = WindowedSinc((p->super_Tuple2<pbrt::Point2,_float>).y,
                       (this->radius).super_Tuple2<pbrt::Vector2,_float>.y,this->tau);
  return FVar2 * FVar1;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(const Point2f &p) const {
        return WindowedSinc(p.x, radius.x, tau) * WindowedSinc(p.y, radius.y, tau);
    }